

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizard::setField(QWizard *this,QString *name,QVariant *value)

{
  long lVar1;
  char cVar2;
  const_iterator cVar3;
  QVariant *pQVar4;
  long lVar5;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  if (((*(long *)(lVar1 + 0x300) == 0) ||
      (cVar3 = std::
               _Rb_tree<QString,_std::pair<const_QString,_int>,_std::_Select1st<std::pair<const_QString,_int>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>
               ::find((_Rb_tree<QString,_std::pair<const_QString,_int>,_std::_Select1st<std::pair<const_QString,_int>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>
                       *)(*(long *)(lVar1 + 0x300) + 8),name),
      cVar3._M_node == (_Base_ptr)(*(long *)(lVar1 + 0x300) + 0x10))) ||
     ((long)*(int *)&cVar3._M_node[1]._M_right == -1)) {
    setField();
    return;
  }
  lVar1 = *(long *)(lVar1 + 0x2f0);
  lVar5 = (long)*(int *)&cVar3._M_node[1]._M_right * 0x80;
  pQVar4 = *(QVariant **)(lVar1 + 0x38 + lVar5);
  if (pQVar4 == (QVariant *)0x0) {
    pQVar4 = (QVariant *)&QByteArray::_empty;
  }
  cVar2 = QObject::doSetProperty(*(char **)(lVar1 + 0x28 + lVar5),pQVar4,value);
  if (cVar2 != '\0') {
    return;
  }
  setField((QWizard *)(lVar1 + lVar5 + 0x38));
  return;
}

Assistant:

void QWizard::setField(const QString &name, const QVariant &value)
{
    Q_D(QWizard);

    int index = d->fieldIndexMap.value(name, -1);
    if (Q_UNLIKELY(index == -1)) {
        qWarning("QWizard::setField: No such field '%ls'", qUtf16Printable(name));
        return;
    }

    const QWizardField &field = d->fields.at(index);
    if (Q_UNLIKELY(!field.object->setProperty(field.property, value)))
        qWarning("QWizard::setField: Couldn't write to property '%s'",
                 field.property.constData());
}